

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

vector<Lit,_std::allocator<Lit>_> * __thiscall
GraphPropagator::fullExpl
          (vector<Lit,_std::allocator<Lit>_> *__return_storage_ptr__,GraphPropagator *this,bool fail
          )

{
  uint uVar1;
  iterator iVar2;
  BoolView *pBVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000011,fail) == 0) {
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<>(__return_storage_ptr__,iVar2);
    }
    else {
      (iVar2._M_current)->x = -2;
      (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
  }
  if (0 < (int)(this->vs).sz) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pBVar3 = (this->vs).data;
      if (sat.assigns.data
          [*(uint *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar5)] != '\0') {
        uVar1 = *(uint *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar5);
        iVar4 = (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2;
        local_38 = CONCAT44(iVar4,local_38._0_4_);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (__return_storage_ptr__,iVar2,(Lit *)((long)&local_38 + 4));
        }
        else {
          (iVar2._M_current)->x = iVar4;
          (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pBVar3 = (this->es).data;
      if (sat.assigns.data
          [*(uint *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar5)] != '\0') {
        uVar1 = *(uint *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar5);
        iVar4 = (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2;
        local_38 = CONCAT44(local_38._4_4_,iVar4);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (__return_storage_ptr__,iVar2,(Lit *)&local_38);
        }
        else {
          (iVar2._M_current)->x = iVar4;
          (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)(this->es).sz);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Lit> GraphPropagator::fullExpl(bool fail) {
	std::vector<Lit> ps;
	if (!fail) {
		ps.emplace_back();
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
	return ps;
}